

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopStart(Mem_Flex_t *pMan,int nCubes,int nVars)

{
  char *__s;
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  
  uVar1 = (ulong)(uint)nCubes;
  iVar3 = (nVars + 3) * nCubes;
  __s = Mem_FlexEntryFetch(pMan,iVar3 + 1);
  memset(__s,0x2d,(long)iVar3);
  __s[iVar3] = '\0';
  if (0 < nCubes) {
    pcVar2 = __s + (long)nVars + 2;
    do {
      pcVar2[-2] = ' ';
      pcVar2[-1] = '1';
      *pcVar2 = '\n';
      pcVar2 = pcVar2 + (nVars + 3);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return __s;
}

Assistant:

char * Abc_SopStart( Mem_Flex_t * pMan, int nCubes, int nVars )
{
    char * pSopCover, * pCube;
    int i, Length;

    Length = nCubes * (nVars + 3);
    pSopCover = Mem_FlexEntryFetch( pMan, Length + 1 );
    memset( pSopCover, '-', (size_t)Length );
    pSopCover[Length] = 0;

    for ( i = 0; i < nCubes; i++ )
    {
        pCube = pSopCover + i * (nVars + 3);
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    return pSopCover;
}